

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseDocTypeDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr in;
  internalSubsetSAXFunc p_Var2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  bool bVar6;
  xmlChar *ExternalID;
  xmlChar *local_28;
  
  local_28 = (xmlChar *)0x0;
  bVar6 = ctxt->mlType == XML_TYPE_XML;
  in = ctxt->input;
  pxVar4 = in->cur;
  in->cur = pxVar4 + (ulong)bVar6 + 8;
  in->col = (uint)bVar6 + in->col + 8;
  if (pxVar4[(ulong)bVar6 + 8] == '\0') {
    xmlParserInputGrow(in,0xfa);
  }
  xmlSkipBlankChars(ctxt);
  pxVar4 = xmlParseName(ctxt);
  if (pxVar4 == (xmlChar *)0x0) {
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseDocTypeDecl : no DOCTYPE name !\n");
  }
  ctxt->intSubName = pxVar4;
  xmlSkipBlankChars(ctxt);
  pxVar5 = xmlParseExternalID(ctxt,&local_28,1);
  pxVar3 = local_28;
  if (pxVar5 != (xmlChar *)0x0 || local_28 != (xmlChar *)0x0) {
    ctxt->hasExternalSubset = 1;
  }
  ctxt->extSubURI = pxVar5;
  ctxt->extSubSystem = local_28;
  xmlSkipBlankChars(ctxt);
  if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
      (p_Var2 = ctxt->sax->internalSubset, p_Var2 != (internalSubsetSAXFunc)0x0)) &&
     (ctxt->disableSAX == 0)) {
    (*p_Var2)(ctxt->userData,pxVar4,pxVar3,pxVar5);
  }
  if (ctxt->instate != XML_PARSER_EOF) {
    xVar1 = *ctxt->input->cur;
    if (xVar1 != '[') {
      if ((xVar1 != '>' || ctxt->mlType != XML_TYPE_XML) &&
         ((ctxt->mlType != XML_TYPE_SML || ((xVar1 != '\n' && (xVar1 != ';')))))) {
        xmlFatalErr(ctxt,XML_ERR_DOCTYPE_NOT_FINISHED,(char *)0x0);
      }
      xmlNextChar(ctxt);
      return;
    }
  }
  return;
}

Assistant:

void
xmlParseDocTypeDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name = NULL;
    xmlChar *ExternalID = NULL;
    xmlChar *URI = NULL;

    DEBUG_ENTER(("xmlParseDocTypeDecl(%s);\n", dbgCtxt(ctxt)));

    /*
     * We know that '<!DOCTYPE' has been detected.
     */
    SKIP_MLI(9);

    SKIP_BLANKS;

    /*
     * Parse the DOCTYPE name.
     */
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
		       "xmlParseDocTypeDecl : no DOCTYPE name !\n");
    }
    ctxt->intSubName = name;

    SKIP_BLANKS;

    /*
     * Check for SystemID and ExternalID
     */
    URI = xmlParseExternalID(ctxt, &ExternalID, 1);

    if ((URI != NULL) || (ExternalID != NULL)) {
        ctxt->hasExternalSubset = 1;
    }
    ctxt->extSubURI = URI;
    ctxt->extSubSystem = ExternalID;

    SKIP_BLANKS;

    /*
     * Create and update the internal subset.
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->internalSubset != NULL) &&
	(!ctxt->disableSAX))
	ctxt->sax->internalSubset(ctxt->userData, name, ExternalID, URI);
    if (ctxt->instate == XML_PARSER_EOF)
	RETURN();

    /*
     * Is there any internal subset declarations ?
     * they are handled separately in xmlParseInternalSubset()
     */
    if (RAW == '[')
	RETURN();

    /*
     * We should be at the end of the DOCTYPE declaration.
     */
    if (!RAW_IS_GT_MLI) { /* (RAW != '>') */
	xmlFatalErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED, NULL);
    }
    NEXT;
    RETURN();
}